

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_transaction.cpp
# Opt level: O1

int CfdGetTxOut(void *handle,int net_type,char *tx_hex_string,uint32_t index,int64_t *value_satoshi,
               char **locking_script)

{
  bool bVar1;
  int64_t iVar2;
  char *pcVar3;
  CfdException *this;
  bool is_bitcoin;
  Script temp_locking_script;
  TransactionContext tx;
  TxOutReference ref;
  bool local_281;
  Amount local_280;
  Script local_270;
  Script local_238;
  undefined1 local_200 [16];
  undefined1 local_1f0 [232];
  undefined1 local_108 [24];
  Script local_f0 [3];
  
  cfd::Initialize();
  bVar1 = cfd::capi::IsEmptyString(tx_hex_string);
  if (!bVar1) {
    local_281 = false;
    cfd::capi::ConvertNetType(net_type,&local_281);
    cfd::core::Amount::Amount(&local_280);
    cfd::core::Script::Script(&local_238);
    if (local_281 == true) {
      std::__cxx11::string::string((string *)local_108,tx_hex_string,(allocator *)&local_270);
      cfd::TransactionContext::TransactionContext
                ((TransactionContext *)local_200,(string *)local_108);
      if ((undefined1 *)local_108._0_8_ != local_108 + 0x10) {
        operator_delete((void *)local_108._0_8_,CONCAT71(local_108._17_7_,local_108[0x10]) + 1);
      }
      cfd::core::Transaction::GetTxOut((TxOutReference *)local_108,(Transaction *)local_200,index);
      local_280.amount_ = local_108._8_8_;
      local_280.ignore_check_ = (bool)local_108[0x10];
      cfd::core::Script::Script(&local_270,local_f0);
      cfd::core::Script::operator=(&local_238,&local_270);
      cfd::core::Script::~Script(&local_270);
      local_108._0_8_ = &PTR__AbstractTxOutReference_0087cca8;
      cfd::core::Script::~Script(local_f0);
      cfd::TransactionContext::~TransactionContext((TransactionContext *)local_200);
    }
    else {
      std::__cxx11::string::string((string *)local_200,tx_hex_string,(allocator *)&local_270);
      cfd::ConfidentialTransactionContext::ConfidentialTransactionContext
                ((ConfidentialTransactionContext *)local_108,(string *)local_200);
      if ((undefined1 *)local_200._0_8_ != local_1f0) {
        operator_delete((void *)local_200._0_8_,(ulong)(local_1f0._0_8_ + 1));
      }
      cfd::core::ConfidentialTransaction::GetTxOut
                ((ConfidentialTxOutReference *)local_200,(ConfidentialTransaction *)local_108,index)
      ;
      local_280.amount_ = CONCAT44(local_200._12_4_,local_200._8_4_);
      local_280.ignore_check_ = (bool)local_1f0[0];
      cfd::core::Script::Script(&local_270,(Script *)(local_1f0 + 8));
      cfd::core::Script::operator=(&local_238,&local_270);
      cfd::core::Script::~Script(&local_270);
      cfd::core::ConfidentialTxOutReference::~ConfidentialTxOutReference
                ((ConfidentialTxOutReference *)local_200);
      cfd::ConfidentialTransactionContext::~ConfidentialTransactionContext
                ((ConfidentialTransactionContext *)local_108);
    }
    if (value_satoshi != (int64_t *)0x0) {
      iVar2 = cfd::core::Amount::GetSatoshiValue(&local_280);
      *value_satoshi = iVar2;
    }
    if (locking_script != (char **)0x0) {
      cfd::core::Script::GetHex_abi_cxx11_((string *)local_200,&local_238);
      pcVar3 = cfd::capi::CreateString((string *)local_200);
      *locking_script = pcVar3;
      if ((undefined1 *)local_200._0_8_ != local_1f0) {
        operator_delete((void *)local_200._0_8_,(ulong)(local_1f0._0_8_ + 1));
      }
    }
    cfd::core::Script::~Script(&local_238);
    return 0;
  }
  local_200._0_8_ = "cfdcapi_transaction.cpp";
  local_200._8_4_ = 0xa41;
  local_1f0._0_8_ = "CfdGetTxOut";
  cfd::core::logger::log<>
            ((CfdSourceLocation *)local_200,kCfdLogLevelWarning,"tx is null or empty.");
  this = (CfdException *)__cxa_allocate_exception(0x30);
  local_200._0_8_ = local_1f0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_200,"Failed to parameter. tx is null or empty.","");
  cfd::core::CfdException::CfdException(this,kCfdIllegalArgumentError,(string *)local_200);
  __cxa_throw(this,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdGetTxOut(
    void* handle, int net_type, const char* tx_hex_string, uint32_t index,
    int64_t* value_satoshi, char** locking_script) {
  try {
    cfd::Initialize();
    if (IsEmptyString(tx_hex_string)) {
      warn(CFD_LOG_SOURCE, "tx is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. tx is null or empty.");
    }

    bool is_bitcoin = false;
    ConvertNetType(net_type, &is_bitcoin);
    Amount temp_value;
    Script temp_locking_script;
    if (is_bitcoin) {
      TransactionContext tx(tx_hex_string);
      const TxOutReference ref = tx.GetTxOut(index);
      temp_value = ref.GetValue();
      temp_locking_script = ref.GetLockingScript();
    } else {
#ifndef CFD_DISABLE_ELEMENTS
      ConfidentialTransactionContext tx(tx_hex_string);
      const ConfidentialTxOutReference ref = tx.GetTxOut(index);
      temp_value = ref.GetValue();
      temp_locking_script = ref.GetLockingScript();
#else
      throw CfdException(
          CfdError::kCfdIllegalArgumentError, "Elements is not supported.");
#endif  // CFD_DISABLE_ELEMENTS
    }

    if (value_satoshi != nullptr) {
      *value_satoshi = temp_value.GetSatoshiValue();
    }
    if (locking_script != nullptr) {
      *locking_script = CreateString(temp_locking_script.GetHex());
    }
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    return SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
    return CfdErrorCode::kCfdUnknownError;
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
    return CfdErrorCode::kCfdUnknownError;
  }
}